

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cc
# Opt level: O2

void __thiscall
brotli::BlockEncoder::StoreSymbolWithContext<6>
          (BlockEncoder *this,size_t symbol,size_t context,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *context_map,size_t *storage_ix,
          uint8_t *storage)

{
  size_t sVar1;
  long lVar2;
  
  sVar1 = this->block_len_;
  if (sVar1 == 0) {
    sVar1 = this->block_ix_;
    this->block_ix_ = sVar1 + 1;
    this->block_len_ =
         (ulong)(this->block_lengths_->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar1 + 1];
    this->entropy_ix_ =
         (ulong)(this->block_types_->
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar1 + 1] << 6;
    StoreBlockSwitch(&this->block_split_code_,sVar1 + 1,storage_ix,storage);
    sVar1 = this->block_len_;
  }
  this->block_len_ = sVar1 - 1;
  lVar2 = (ulong)(context_map->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start[this->entropy_ix_ + context] *
          this->alphabet_size_ + symbol;
  WriteBits((ulong)(this->depths_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar2],
            (ulong)(this->bits_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar2],storage_ix,storage);
  return;
}

Assistant:

void StoreSymbolWithContext(size_t symbol, size_t context,
                              const std::vector<uint32_t>& context_map,
                              size_t* storage_ix, uint8_t* storage) {
    if (block_len_ == 0) {
      ++block_ix_;
      block_len_ = block_lengths_[block_ix_];
      size_t block_type = block_types_[block_ix_];
      entropy_ix_ = block_type << kContextBits;
      StoreBlockSwitch(block_split_code_, block_ix_, storage_ix, storage);
    }
    --block_len_;
    size_t histo_ix = context_map[entropy_ix_ + context];
    size_t ix = histo_ix * alphabet_size_ + symbol;
    WriteBits(depths_[ix], bits_[ix], storage_ix, storage);
  }